

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O2

void __thiscall FNotifyBuffer::AddString(FNotifyBuffer *this,int printlevel,FString *source)

{
  char cVar1;
  FNotifyText *pFVar2;
  int iVar3;
  uint uVar4;
  anon_enum_32 aVar5;
  FString *other;
  FString str;
  FString local_48;
  FBrokenLines *local_40;
  FString *local_38;
  
  if ((printlevel != 0x80) && (!show_messages.Value)) {
    return;
  }
  if (*(int *)(source->Chars + -0xc) == 0) {
    return;
  }
  if ((uint)(gamestate + GS_FORCEWIPEBURN) < 2) {
    return;
  }
  if (con_notifylines.Value == 0) {
    return;
  }
  if (ConsoleDrawing == '\x01') {
    EnqueueConsoleText(true,printlevel,source->Chars);
    return;
  }
  iVar3 = active_con_scaletext();
  if (iVar3 == 0) {
    iVar3 = CleanXfac;
  }
  iVar3 = DisplayWidth / iVar3;
  if ((this->AddType == APPENDLINE) && (uVar4 = (this->Text).Count, uVar4 != 0)) {
    uVar4 = uVar4 - 1;
    pFVar2 = (this->Text).Array;
    if (pFVar2[uVar4].PrintLevel == printlevel) {
      FString::operator+(&str,&pFVar2[uVar4].Text);
      local_40 = V_BreakLines(SmallFont,iVar3,(BYTE *)CONCAT44(str.Chars._4_4_,(int)str.Chars),false
                             );
      FString::~FString(&str);
      goto LAB_0036f566;
    }
  }
  local_40 = V_BreakLines(SmallFont,iVar3,source,false);
  if (this->AddType == APPENDLINE) {
    this->AddType = NEWLINE;
  }
LAB_0036f566:
  if (local_40 != (FBrokenLines *)0x0) {
    local_38 = source;
    for (other = &local_40->Text; -1 < ((FBrokenLines *)(other + -1))->Width; other = other + 2) {
      local_48.Chars = FString::NullString.Nothing;
      FString::NullString.RefCount = FString::NullString.RefCount + 1;
      FString::operator=(&local_48,other);
      str.Chars._0_4_ = (int)(con_notifytime.Value * 35.0) + gametic;
      str.Chars._4_4_ = printlevel;
      if ((this->AddType == NEWLINE) || (uVar4 = (this->Text).Count, uVar4 == 0)) {
        if (0 < con_notifylines.Value) {
          Shift(this,con_notifylines.Value + -1);
        }
        TArray<FNotifyText,_FNotifyText>::Push(&this->Text,(FNotifyText *)&str);
      }
      else {
        FNotifyText::operator=((this->Text).Array + (uVar4 - 1),(FNotifyText *)&str);
      }
      this->AddType = NEWLINE;
      FString::~FString(&local_48);
    }
    V_FreeBrokenLines(local_40);
    cVar1 = local_38->Chars[(ulong)*(uint *)(local_38->Chars + -0xc) - 1];
    aVar5 = REPLACELINE;
    if (cVar1 != '\r') {
      aVar5 = (anon_enum_32)(cVar1 != '\n');
    }
    this->AddType = aVar5;
    this->TopGoal = 0;
  }
  return;
}

Assistant:

void FNotifyBuffer::AddString(int printlevel, FString source)
{
	FBrokenLines *lines;
	int i, width;

	if ((printlevel != 128 && !show_messages) ||
		source.IsEmpty() ||
		gamestate == GS_FULLCONSOLE ||
		gamestate == GS_DEMOSCREEN ||
		con_notifylines == 0)
		return;

	if (ConsoleDrawing)
	{
		EnqueueConsoleText (true, printlevel, source);
		return;
	}

	if (active_con_scaletext() == 0)
	{
		width = DisplayWidth / CleanXfac;
	}
	else
	{
		width = DisplayWidth / active_con_scaletext();
	}

	if (AddType == APPENDLINE && Text.Size() > 0 && Text[Text.Size() - 1].PrintLevel == printlevel)
	{
		FString str = Text[Text.Size() - 1].Text + source;
		lines = V_BreakLines (SmallFont, width, str);
	}
	else
	{
		lines = V_BreakLines (SmallFont, width, source);
		if (AddType == APPENDLINE)
		{
			AddType = NEWLINE;
		}
	}

	if (lines == NULL)
		return;

	for (i = 0; lines[i].Width >= 0; i++)
	{
		FNotifyText newline;

		newline.Text = lines[i].Text;
		newline.TimeOut = gametic + int(con_notifytime * TICRATE);
		newline.PrintLevel = printlevel;
		if (AddType == NEWLINE || Text.Size() == 0)
		{
			if (con_notifylines > 0)
			{
				Shift(con_notifylines - 1);
			}
			Text.Push(newline);
		}
		else
		{
			Text[Text.Size() - 1] = newline;
		}
		AddType = NEWLINE;
	}

	V_FreeBrokenLines (lines);
	lines = NULL;

	switch (source[source.Len()-1])
	{
	case '\r':	AddType = REPLACELINE;	break;
	case '\n':	AddType = NEWLINE;		break;
	default:	AddType = APPENDLINE;	break;
	}

	TopGoal = 0;
}